

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void av1_init_tile_data(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  TileDataEnc *tile;
  AV1_COMP *in_RDI;
  TileInfo *tile_info;
  TileDataEnc *tile_data;
  _Bool realloc_tokens;
  uint tokens_required;
  int tplist_count;
  uint tile_tok;
  TokenList *tplist;
  TokenExtra *pre_tok;
  TokenInfo *token_info;
  int tile_row;
  int tile_col;
  int tile_rows;
  int tile_cols;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  AV1_COMMON *in_stack_ffffffffffffffa0;
  TileDataEnc *tile_00;
  int local_48;
  uint local_44;
  TokenList *local_40;
  TokenExtra *local_38;
  int local_24;
  int local_20;
  
  iVar4 = av1_num_planes(&in_RDI->common);
  iVar1 = (in_RDI->common).tiles.cols;
  iVar2 = (in_RDI->common).tiles.rows;
  local_38 = (in_RDI->token_info).tile_tok[0][0];
  local_40 = (in_RDI->token_info).tplist[0][0];
  local_44 = 0;
  local_48 = 0;
  iVar5 = is_stat_generation_stage(in_RDI);
  if (((iVar5 == 0) && (((in_RDI->common).features.allow_screen_content_tools & 1U) != 0)) &&
     (uVar6 = get_token_alloc((in_RDI->common).mi_params.mb_rows,(in_RDI->common).mi_params.mb_cols,
                              7,iVar4), (in_RDI->token_info).tokens_allocated < uVar6)) {
    free_token_info((TokenInfo *)0x1f5206);
    alloc_token_info(in_stack_ffffffffffffffa0,
                     (TokenInfo *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    local_38 = (in_RDI->token_info).tile_tok[0][0];
    local_40 = (in_RDI->token_info).tplist[0][0];
  }
  for (local_24 = 0; local_24 < iVar2; local_24 = local_24 + 1) {
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      tile = in_RDI->tile_data + (local_24 * iVar1 + local_20);
      tile_00 = tile;
      av1_tile_init(&tile->tile_info,
                    (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0,
                    0x1f52b2);
      (tile->firstpass_top_mv).row = 0;
      (tile->firstpass_top_mv).col = 0;
      tile->abs_sum_level = 0;
      _Var3 = is_token_info_allocated(&in_RDI->token_info);
      uVar6 = in_stack_ffffffffffffff9c;
      if (_Var3) {
        (in_RDI->token_info).tile_tok[local_24][local_20] = local_38 + local_44;
        local_38 = (in_RDI->token_info).tile_tok[local_24][local_20];
        local_44 = allocated_tokens(&tile_00->tile_info,in_stack_ffffffffffffff9c,
                                    in_stack_ffffffffffffff98);
        (in_RDI->token_info).tplist[local_24][local_20] = local_40 + local_48;
        local_40 = (in_RDI->token_info).tplist[local_24][local_20];
        local_48 = av1_get_sb_rows_in_tile(&in_RDI->common,&tile_00->tile_info);
        uVar6 = in_stack_ffffffffffffff9c;
      }
      tile->allow_update_cdf = ((in_RDI->common).tiles.large_scale != 0 ^ 0xffU) & 1;
      in_stack_ffffffffffffff9c = uVar6 & 0xffffff;
      if ((tile->allow_update_cdf != '\0') &&
         (in_stack_ffffffffffffff9c = uVar6 & 0xffffff,
         ((in_RDI->common).features.disable_cdf_update & 1U) == 0)) {
        iVar4 = delay_wait_for_top_right_sb
                          ((AV1_COMP *)
                           (CONCAT44(uVar6,in_stack_ffffffffffffff98) & 0xffffffffffffff));
        in_stack_ffffffffffffff9c =
             CONCAT13(iVar4 != 0,(int3)in_stack_ffffffffffffff9c) ^ 0xff000000;
      }
      tile->allow_update_cdf = (byte)(in_stack_ffffffffffffff9c >> 0x18) & 1;
      memcpy(&tile->tctx,(in_RDI->common).fc,0x52fc);
    }
  }
  return;
}

Assistant:

void av1_init_tile_data(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int tile_col, tile_row;
  TokenInfo *const token_info = &cpi->token_info;
  TokenExtra *pre_tok = token_info->tile_tok[0][0];
  TokenList *tplist = token_info->tplist[0][0];
  unsigned int tile_tok = 0;
  int tplist_count = 0;

  if (!is_stat_generation_stage(cpi) &&
      cm->features.allow_screen_content_tools) {
    // Number of tokens for which token info needs to be allocated.
    unsigned int tokens_required =
        get_token_alloc(cm->mi_params.mb_rows, cm->mi_params.mb_cols,
                        MAX_SB_SIZE_LOG2, num_planes);
    // Allocate/reallocate memory for token related info if the number of tokens
    // required is more than the number of tokens already allocated. This could
    // occur in case of the following:
    // 1) If the memory is not yet allocated
    // 2) If the frame dimensions have changed
    const bool realloc_tokens = tokens_required > token_info->tokens_allocated;
    if (realloc_tokens) {
      free_token_info(token_info);
      alloc_token_info(cm, token_info, tokens_required);
      pre_tok = token_info->tile_tok[0][0];
      tplist = token_info->tplist[0][0];
    }
  }

  for (tile_row = 0; tile_row < tile_rows; ++tile_row) {
    for (tile_col = 0; tile_col < tile_cols; ++tile_col) {
      TileDataEnc *const tile_data =
          &cpi->tile_data[tile_row * tile_cols + tile_col];
      TileInfo *const tile_info = &tile_data->tile_info;
      av1_tile_init(tile_info, cm, tile_row, tile_col);
      tile_data->firstpass_top_mv = kZeroMv;
      tile_data->abs_sum_level = 0;

      if (is_token_info_allocated(token_info)) {
        token_info->tile_tok[tile_row][tile_col] = pre_tok + tile_tok;
        pre_tok = token_info->tile_tok[tile_row][tile_col];
        tile_tok = allocated_tokens(
            tile_info, cm->seq_params->mib_size_log2 + MI_SIZE_LOG2,
            num_planes);
        token_info->tplist[tile_row][tile_col] = tplist + tplist_count;
        tplist = token_info->tplist[tile_row][tile_col];
        tplist_count = av1_get_sb_rows_in_tile(cm, tile_info);
      }
      tile_data->allow_update_cdf = !cm->tiles.large_scale;
      tile_data->allow_update_cdf = tile_data->allow_update_cdf &&
                                    !cm->features.disable_cdf_update &&
                                    !delay_wait_for_top_right_sb(cpi);
      tile_data->tctx = *cm->fc;
    }
  }
}